

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::emit_cbuffer_load_root_constant(Impl *impl,CallInst *instruction)

{
  Id base_ptr;
  bool bVar1;
  mapped_type *pmVar2;
  Value *local_28;
  
  base_ptr = impl->root_constant_id;
  local_28 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pmVar2 = std::__detail::
           _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_root_member_offset,&local_28);
  bVar1 = emit_cbuffer_load_from_uints
                    (impl,instruction,base_ptr,StorageClassPushConstant,*pmVar2,
                     impl->root_descriptor_count + impl->root_constant_num_words);
  return bVar1;
}

Assistant:

static bool emit_cbuffer_load_root_constant(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	return emit_cbuffer_load_from_uints(impl, instruction,
	                                    impl.root_constant_id,
	                                    spv::StorageClassPushConstant,
	                                    impl.handle_to_root_member_offset[instruction->getOperand(1)],
	                                    impl.root_constant_num_words + impl.root_descriptor_count);
}